

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rgbd_standalone.cpp
# Opt level: O2

void __thiscall Intel_V4L2::getLRFrames(Intel_V4L2 *this,uchar *left_rect,uchar *right_rect)

{
  int *piVar1;
  undefined2 uVar2;
  int i_1;
  int iVar3;
  ostream *poVar4;
  uchar *puVar5;
  int i;
  long lVar6;
  int j;
  long lVar7;
  uchar *puVar8;
  uchar *puVar9;
  Mat rightMat;
  Mat leftMat;
  MatExpr local_250 [16];
  long local_240;
  long *local_208;
  MatExpr local_1f0 [16];
  long local_1e0;
  long *local_1a8;
  MatExpr local_190 [352];
  
  iVar3 = capture_frame(this);
  if (iVar3 != 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Error : failed to capture Infrared frame.");
    std::endl<char,std::char_traits<char>>(poVar4);
    return;
  }
  puVar5 = this->m_pBigBuffer;
  puVar8 = left_rect;
  puVar9 = right_rect;
  for (lVar6 = 0; lVar6 != 0x1e0; lVar6 = lVar6 + 1) {
    for (lVar7 = 0; lVar7 != 0x280; lVar7 = lVar7 + 1) {
      uVar2 = *(undefined2 *)(puVar5 + lVar7 * 2);
      puVar8[lVar7] = (uchar)uVar2;
      puVar9[lVar7] = (uchar)((ushort)uVar2 >> 8);
    }
    puVar9 = puVar9 + 0x280;
    puVar8 = puVar8 + 0x280;
    puVar5 = puVar5 + 0x500;
  }
  cv::Mat::zeros((int)local_190,0x1e0,0x280);
  cv::MatExpr::operator_cast_to_Mat(local_1f0);
  cv::MatExpr::~MatExpr(local_190);
  cv::Mat::zeros((int)local_190,0x1e0,0x280);
  cv::MatExpr::operator_cast_to_Mat(local_250);
  cv::MatExpr::~MatExpr(local_190);
  for (lVar6 = 0; lVar6 != 0x1e0; lVar6 = lVar6 + 1) {
    for (lVar7 = 0; lVar7 != 0x280; lVar7 = lVar7 + 1) {
      *(uchar *)(lVar7 + *local_1a8 * lVar6 + local_1e0) = left_rect[lVar7];
      *(uchar *)(lVar7 + *local_208 * lVar6 + local_240) = right_rect[lVar7];
    }
    right_rect = right_rect + 0x280;
    left_rect = left_rect + 0x280;
  }
  CameraBase::saveFrame(&this->super_CameraBase,(Mat *)local_1f0,(Mat *)local_250);
  piVar1 = &(this->super_CameraBase).m_frameCount;
  *piVar1 = *piVar1 + 1;
  cv::Mat::~Mat((Mat *)local_250);
  cv::Mat::~Mat((Mat *)local_1f0);
  return;
}

Assistant:

void Intel_V4L2::getLRFrames (unsigned char *left_rect, unsigned char *right_rect) {
    int status = capture_frame ();
    if (0 != status) {
        std::cout << "Error : failed to capture Infrared frame." << std::endl;
        return;
    }
    unsigned short *interlacedBuffer = (unsigned short *) m_pBigBuffer;
    for (int i = 0; i < 480; i++) {
        for (int j = 0; j < 640; j++) {
            unsigned short lr_pixel = interlacedBuffer[i*640+j];
            left_rect[i*640+j]  = lr_pixel % 256;
            right_rect[i*640+j] = lr_pixel / 256;
        }
    }

    #if 1
    cv::Mat leftMat  = cv::Mat::zeros (480, 640, CV_8U);
    cv::Mat rightMat = cv::Mat::zeros (480, 640, CV_8U);

    for (int i = 0; i < 480; i++) {
        for (int j = 0; j < 640; j++) {
            leftMat.at<uchar>(i, j)  = left_rect[i*640+j];
            rightMat.at<uchar>(i, j) = right_rect[i*640+j];
        }
    }

    saveFrame (leftMat, rightMat);

    incrementFrameCount ();
    #endif
}